

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListMatrixAddVariable(Fxu_Matrix *p,Fxu_Var *pLink)

{
  Fxu_ListVar *pList;
  Fxu_Var *pLink_local;
  Fxu_Matrix *p_local;
  
  if ((p->lVars).pHead == (Fxu_Var *)0x0) {
    (p->lVars).pHead = pLink;
    (p->lVars).pTail = pLink;
    pLink->pPrev = (Fxu_Var *)0x0;
    pLink->pNext = (Fxu_Var *)0x0;
  }
  else {
    pLink->pNext = (Fxu_Var *)0x0;
    ((p->lVars).pTail)->pNext = pLink;
    pLink->pPrev = (p->lVars).pTail;
    (p->lVars).pTail = pLink;
  }
  (p->lVars).nItems = (p->lVars).nItems + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

// matrix -> var

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fxu_ListMatrixAddVariable( Fxu_Matrix * p, Fxu_Var * pLink ) 
{
    Fxu_ListVar * pList = &p->lVars;
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pPrev = NULL;
        pLink->pNext = NULL;
    }
    else
    {
        pLink->pNext = NULL;
        pList->pTail->pNext = pLink;
        pLink->pPrev = pList->pTail;
        pList->pTail = pLink;
    }
    pList->nItems++;
}